

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_BigNum.cpp
# Opt level: O0

bool __thiscall axl::cry::BigNum::create(BigNum *this)

{
  bool bVar1;
  BIGNUM *pBVar2;
  int in_ESI;
  Handle<bignum_st_*,_axl::cry::FreeBigNum,_axl::sl::Zero<bignum_st_*>_> *in_RDI;
  
  sl::Handle<bignum_st_*,_axl::cry::FreeBigNum,_axl::sl::Zero<bignum_st_*>_>::close(in_RDI,in_ESI);
  pBVar2 = BN_new();
  in_RDI->m_h = (bignum_st *)pBVar2;
  bVar1 = completeWithLastCryptoError(0);
  return bVar1;
}

Assistant:

bool
BigNum::create() {
	close();

	m_h = BN_new();
	return completeWithLastCryptoError(m_h != NULL);
}